

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int32_t zng_deflateSetParams(zng_stream *strm,zng_deflate_param_value *params,size_t count)

{
  zng_deflate_param zVar1;
  internal_state *piVar2;
  bool bVar3;
  zng_deflate_param_value *pzVar4;
  zng_deflate_param_value *pzVar5;
  zng_deflate_param_value *pzVar6;
  int iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t *piVar10;
  int *piVar11;
  int *piVar12;
  size_t sVar13;
  zng_deflate_param_value *pzVar14;
  zng_deflate_param_value *pzVar15;
  zng_deflate_param_value *pzVar16;
  zng_deflate_param_value *pzVar17;
  bool bVar18;
  bool bVar19;
  
  piVar10 = &params->status;
  sVar13 = count;
  while (bVar18 = sVar13 != 0, sVar13 = sVar13 - 1, bVar18) {
    *piVar10 = 0;
    piVar10 = piVar10 + 8;
  }
  iVar7 = deflateStateCheck(strm);
  if (iVar7 == 0) {
    piVar2 = strm->state;
    pzVar15 = (zng_deflate_param_value *)0x0;
    pzVar14 = (zng_deflate_param_value *)0x0;
    bVar3 = false;
    bVar18 = false;
    pzVar17 = (zng_deflate_param_value *)0x0;
    while (bVar19 = count != 0, count = count - 1, bVar19) {
      zVar1 = params->param;
      iVar9 = -5;
      if (zVar1 == Z_DEFLATE_REPRODUCIBLE) {
        pzVar16 = params;
        if (pzVar17 == (zng_deflate_param_value *)0x0) goto LAB_0012b76a;
LAB_0012b740:
        pzVar17->status = -5;
        bVar19 = true;
LAB_0012b78a:
        params->status = iVar9;
        bVar18 = bVar19;
      }
      else {
        pzVar4 = pzVar14;
        pzVar5 = pzVar15;
        pzVar6 = params;
        pzVar16 = pzVar17;
        if ((zVar1 != Z_DEFLATE_STRATEGY) &&
           (pzVar4 = pzVar15, pzVar5 = params, pzVar6 = pzVar14, zVar1 != Z_DEFLATE_LEVEL)) {
          iVar9 = -6;
          bVar3 = true;
          bVar19 = bVar18;
          goto LAB_0012b78a;
        }
        pzVar14 = pzVar6;
        pzVar15 = pzVar5;
        pzVar17 = pzVar4;
        if (pzVar4 != (zng_deflate_param_value *)0x0) goto LAB_0012b740;
LAB_0012b76a:
        bVar19 = true;
        if (params->size < 4) goto LAB_0012b78a;
      }
      params = params + 1;
      pzVar17 = pzVar16;
    }
    if (bVar18) {
      iVar8 = -5;
    }
    else {
      bVar18 = true;
      if (pzVar15 != (zng_deflate_param_value *)0x0 || pzVar14 != (zng_deflate_param_value *)0x0) {
        if (pzVar15 == (zng_deflate_param_value *)0x0) {
          piVar11 = &piVar2->level;
        }
        else {
          piVar11 = (int *)pzVar15->buf;
        }
        if (pzVar14 == (zng_deflate_param_value *)0x0) {
          piVar12 = &piVar2->strategy;
        }
        else {
          piVar12 = (int *)pzVar14->buf;
        }
        iVar9 = zng_deflateParams(strm,*piVar11,*piVar12);
        if (iVar9 != 0) {
          if (pzVar15 != (zng_deflate_param_value *)0x0) {
            pzVar15->status = -2;
          }
          if (pzVar14 != (zng_deflate_param_value *)0x0) {
            pzVar14->status = -2;
          }
          bVar18 = false;
        }
      }
      if (pzVar17 != (zng_deflate_param_value *)0x0) {
        piVar2->reproducible = *pzVar17->buf;
      }
      iVar9 = -6;
      if (!bVar3) {
        iVar9 = 0;
      }
      iVar8 = -2;
      if (bVar18) {
        iVar8 = iVar9;
      }
    }
  }
  else {
    iVar8 = -2;
  }
  return iVar8;
}

Assistant:

int32_t Z_EXPORT zng_deflateSetParams(zng_stream *strm, zng_deflate_param_value *params, size_t count) {
    size_t i;
    deflate_state *s;
    zng_deflate_param_value *new_level = NULL;
    zng_deflate_param_value *new_strategy = NULL;
    zng_deflate_param_value *new_reproducible = NULL;
    int param_buf_error;
    int version_error = 0;
    int buf_error = 0;
    int stream_error = 0;

    /* Initialize the statuses. */
    for (i = 0; i < count; i++)
        params[i].status = Z_OK;

    /* Check whether the stream state is consistent. */
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    /* Check buffer sizes and detect duplicates. */
    for (i = 0; i < count; i++) {
        switch (params[i].param) {
            case Z_DEFLATE_LEVEL:
                param_buf_error = deflateSetParamPre(&new_level, sizeof(int), &params[i]);
                break;
            case Z_DEFLATE_STRATEGY:
                param_buf_error = deflateSetParamPre(&new_strategy, sizeof(int), &params[i]);
                break;
            case Z_DEFLATE_REPRODUCIBLE:
                param_buf_error = deflateSetParamPre(&new_reproducible, sizeof(int), &params[i]);
                break;
            default:
                params[i].status = Z_VERSION_ERROR;
                version_error = 1;
                param_buf_error = 0;
                break;
        }
        if (param_buf_error) {
            params[i].status = Z_BUF_ERROR;
            buf_error = 1;
        }
    }
    /* Exit early if small buffers or duplicates are detected. */
    if (buf_error)
        return Z_BUF_ERROR;

    /* Apply changes, remember if there were errors. */
    if (new_level != NULL || new_strategy != NULL) {
        int ret = PREFIX(deflateParams)(strm, new_level == NULL ? s->level : *(int *)new_level->buf,
                                        new_strategy == NULL ? s->strategy : *(int *)new_strategy->buf);
        if (ret != Z_OK) {
            if (new_level != NULL)
                new_level->status = Z_STREAM_ERROR;
            if (new_strategy != NULL)
                new_strategy->status = Z_STREAM_ERROR;
            stream_error = 1;
        }
    }
    if (new_reproducible != NULL) {
        int val = *(int *)new_reproducible->buf;
        if (DEFLATE_CAN_SET_REPRODUCIBLE(strm, val)) {
            s->reproducible = val;
        } else {
            new_reproducible->status = Z_STREAM_ERROR;
            stream_error = 1;
        }
    }

    /* Report version errors only if there are no real errors. */
    return stream_error ? Z_STREAM_ERROR : (version_error ? Z_VERSION_ERROR : Z_OK);
}